

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveWriter.cpp
# Opt level: O0

EStatusCode __thiscall
CFFPrimitiveWriter::WriteCard16(CFFPrimitiveWriter *this,unsigned_short inValue)

{
  EStatusCode EVar1;
  Byte byte2;
  Byte byte1;
  unsigned_short inValue_local;
  CFFPrimitiveWriter *this_local;
  
  EVar1 = WriteByte(this,(Byte)(inValue >> 8));
  if (EVar1 == eSuccess) {
    EVar1 = WriteByte(this,(Byte)inValue);
    if (EVar1 == eSuccess) {
      this_local._4_4_ = eSuccess;
    }
    else {
      this_local._4_4_ = eFailure;
    }
  }
  else {
    this_local._4_4_ = eFailure;
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode CFFPrimitiveWriter::WriteCard16(unsigned short inValue)
{
	Byte byte1 = (inValue>>8) & 0xff;
	Byte byte2 = inValue & 0xff;
    
	if(WriteByte(byte1) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;
    
	if(WriteByte(byte2) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;
    
	return PDFHummus::eSuccess;
}